

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * __thiscall setup::filename_map::lookup(filename_map *this,string *key)

{
  bool bVar1;
  pointer ppVar2;
  _Self *__y;
  string *in_RDI;
  string *in_stack_00000008;
  const_iterator i;
  map<const_boost::system::error_category_*,_std::unique_ptr<boost::system::detail::std_category,_std::default_delete<boost::system::detail::std_category>_>,_boost::system::detail::cat_ptr_less,_std::allocator<std::pair<const_boost::system::error_category_*const,_std::unique_ptr<boost::system::detail::std_category,_std::default_delete<boost::system::detail::std_category>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_28;
  _Base_ptr local_20 [4];
  
  local_20[0] = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffb8,(key_type *)0x170484);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_boost::system::error_category_*,_std::unique_ptr<boost::system::detail::std_category,_std::default_delete<boost::system::detail::std_category>_>,_boost::system::detail::cat_ptr_less,_std::allocator<std::pair<const_boost::system::error_category_*const,_std::unique_ptr<boost::system::detail::std_category,_std::default_delete<boost::system::detail::std_category>_>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::_Base_bitset<1ul>::_M_is_equal((_Base_bitset<1ul> *)local_20,&local_28,__y);
  if (bVar1) {
    anon_unknown_0::replace_unsafe_chars(in_stack_00000008);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<stream::chunk_const,std::map<stream::file,unsigned_long,std::less<stream::file>,std::allocator<std::pair<stream::file_const,unsigned_long>>>>>
             ::operator*((_Rb_tree_iterator<std::pair<const_boost::system::error_category_*const,_std::unique_ptr<boost::system::detail::std_category,_std::default_delete<boost::system::detail::std_category>_>_>_>
                          *)0x1704c8);
    std::__cxx11::string::string((string *)in_RDI,(string *)(ppVar2 + 2));
  }
  return in_RDI;
}

Assistant:

std::string filename_map::lookup(const std::string & key) const {
	std::map<std::string, std::string>::const_iterator i = find(key);
	return (i == end()) ? replace_unsafe_chars(key) : i->second;
}